

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::
         ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  
  plVar3 = (long *)(*(ulong *)(*(long *)(*(FileDescriptor **)(desc + 0x10) + 0x78) + 0x78) &
                   0xfffffffffffffffe);
  lVar1 = plVar3[1];
  if (lVar1 == 0) {
    ReservedNamePrefix(__return_storage_ptr__,classname,*(FileDescriptor **)(desc + 0x10));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar3;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const std::string& classname,
                            const DescriptorType* desc) {
  const std::string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}